

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::modifyInitialFunctions(TranslateToFuzzReader *this)

{
  _Head_base<0UL,_wasm::Function_*,_false> func;
  bool bVar1;
  pointer puVar2;
  Expression *pEVar3;
  ulong uVar4;
  char *extraout_RDX;
  Type type;
  Module *pMVar5;
  ulong uVar6;
  undefined1 local_b0 [8];
  FunctionCreationContext context;
  
  if ((this->wasm->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->wasm->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pMVar5 = this->wasm;
    puVar2 = (pMVar5->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pMVar5->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
      uVar4 = 0;
      uVar6 = 1;
      do {
        func._M_head_impl =
             puVar2[uVar4]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
             super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        if (*(char **)((long)&(func._M_head_impl)->super_Importable + 0x20) == (char *)0x0) {
LAB_00140273:
          if (*(char **)((long)&(func._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
            FunctionCreationContext::FunctionCreationContext
                      ((FunctionCreationContext *)local_b0,this,func._M_head_impl);
            (((Name *)((long)&(func._M_head_impl)->super_Importable + 0x28))->super_IString).str.
            _M_len = 0;
            *(char **)((long)&(func._M_head_impl)->super_Importable + 0x30) = (char *)0x0;
            (((Name *)((long)&(func._M_head_impl)->super_Importable + 0x18))->super_IString).str.
            _M_len = 0;
            *(char **)((long)&(func._M_head_impl)->super_Importable + 0x20) = (char *)0x0;
            ::wasm::HeapType::getSignature();
            pEVar3 = make(this,type);
            (func._M_head_impl)->body = pEVar3;
            FunctionCreationContext::~FunctionCreationContext((FunctionCreationContext *)local_b0);
          }
        }
        else {
          ::wasm::IString::interned(0xf,"fuzzing-support",0);
          if ((*(char **)((long)&(func._M_head_impl)->super_Importable + 0x20) != extraout_RDX) &&
             (this->preserveImportsAndExports == false)) goto LAB_00140273;
        }
        pMVar5 = this->wasm;
        puVar2 = (pMVar5->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar1 = uVar6 < (ulong)((long)(pMVar5->functions).
                                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3
                               );
        uVar4 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar1);
    }
    (pMVar5->start).super_IString.str._M_len = 0;
    (pMVar5->start).super_IString.str._M_str = (char *)0x0;
  }
  return;
}

Assistant:

void TranslateToFuzzReader::modifyInitialFunctions() {
  if (wasm.functions.empty()) {
    return;
  }
  // Do not iterate directly on wasm.functions itself (that is, avoid
  //   for (x : wasm.functions)
  // ) as we may add to it as we go through the functions - make() can add new
  // functions to implement a RefFunc. Instead, use an index. This avoids an
  // iterator invalidation, and also we will process those new functions at
  // the end (currently that is not needed atm, but it might in the future).
  for (Index i = 0; i < wasm.functions.size(); i++) {
    auto* func = wasm.functions[i].get();
    // We can't allow extra imports, as the fuzzing infrastructure wouldn't
    // know what to provide. Keep only our own fuzzer imports (or, if we are
    // preserving imports, keep them all).
    if (func->imported() &&
        (func->module == "fuzzing-support" || preserveImportsAndExports)) {
      continue;
    }
    if (func->imported()) {
      FunctionCreationContext context(*this, func);
      func->module = func->base = Name();
      func->body = make(func->getResults());
    }
  }

  // Remove a start function - the fuzzing harness expects code to run only
  // from exports.
  wasm.start = Name();
}